

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::XFormWidget::cycleMode(XFormWidget *this)

{
  XFormWidget *this_local;
  
  if ((this->poseMode & 1U) == 0) {
    if (this->mode == Translate) {
      this->mode = Rotate;
    }
    else if (this->mode == Rotate) {
      this->mode = Scale;
    }
    else if (this->mode == Scale) {
      this->mode = Translate;
    }
  }
  return;
}

Assistant:

void XFormWidget::cycleMode() {
  if (poseMode) return;

  if (mode == Mode::Translate)
    mode = Mode::Rotate;
  else if (mode == Mode::Rotate)
    mode = Mode::Scale;
  else if (mode == Mode::Scale)
    mode = Mode::Translate;
}